

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall wasm::RemoveUnusedBrs::visitIf(RemoveUnusedBrs *this,If *curr)

{
  Expression *pEVar1;
  bool bVar2;
  PassOptions *pPVar3;
  Module *pMVar4;
  Expression *pEVar5;
  If *pIVar6;
  Const *ifFalse;
  Select *pSVar7;
  Builder local_320;
  Builder builder_1;
  If *child;
  Builder local_1a8;
  Builder builder;
  EffectAnalyzer local_190;
  Type local_30;
  Expression *local_28;
  Expression *zero;
  Break *br;
  If *curr_local;
  RemoveUnusedBrs *this_local;
  
  if (curr->ifFalse != (Expression *)0x0) {
    return;
  }
  br = (Break *)curr;
  curr_local = (If *)this;
  zero = (Expression *)Expression::dynCast<wasm::Break>(curr->ifTrue);
  if ((Break *)zero != (Break *)0x0) {
    pEVar5 = (Expression *)(br->name).super_IString.str._M_len;
    pEVar1 = ((Break *)zero)->value;
    pPVar3 = Pass::getPassOptions((Pass *)this);
    pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                       (&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                         ).
                         super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         .
                         super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                       );
    bVar2 = canTurnIfIntoBrIf(pEVar5,pEVar1,pPVar3,pMVar4);
    if (bVar2) {
      if (zero[2].type.id == 0) {
        zero[2].type.id = (br->name).super_IString.str._M_len;
      }
      else {
        if ((*(long *)(zero + 2) != 0) &&
           (bVar2 = wasm::Type::isTuple((Type *)(*(long *)(zero + 2) + 8)), bVar2)) {
          return;
        }
        wasm::Type::Type(&local_30,i32);
        pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        local_28 = LiteralUtils::makeZero(local_30,pMVar4);
        pPVar3 = Pass::getPassOptions((Pass *)this);
        bVar2 = tooCostlyToRunUnconditionally(pPVar3,(Expression *)zero[2].type.id,local_28);
        if (bVar2) {
          return;
        }
        pPVar3 = Pass::getPassOptions((Pass *)this);
        pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        EffectAnalyzer::EffectAnalyzer(&local_190,pPVar3,pMVar4,(Expression *)zero[2].type.id);
        bVar2 = EffectAnalyzer::hasSideEffects(&local_190);
        EffectAnalyzer::~EffectAnalyzer(&local_190);
        if (bVar2) {
          return;
        }
        pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        Builder::Builder(&local_1a8,pMVar4);
        pSVar7 = Builder::makeSelect(&local_1a8,(Expression *)zero[2].type.id,
                                     (Expression *)(br->name).super_IString.str._M_len,local_28);
        zero[2].type.id = (uintptr_t)pSVar7;
      }
      Break::finalize((Break *)zero);
      pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                           .
                           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         );
      Builder::Builder((Builder *)&child,pMVar4);
      pEVar5 = Builder::dropIfConcretelyTyped((Builder *)&child,zero);
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                  ).
                  super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                  .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>,
                 pEVar5);
      this->anotherCycle = true;
    }
  }
  pIVar6 = Expression::dynCast<wasm::If>((Expression *)(br->name).super_IString.str._M_str);
  if ((pIVar6 != (If *)0x0) && (pIVar6->ifFalse == (Expression *)0x0)) {
    pPVar3 = Pass::getPassOptions((Pass *)this);
    bVar2 = tooCostlyToRunUnconditionally(pPVar3,pIVar6->condition);
    if (!bVar2) {
      pPVar3 = Pass::getPassOptions((Pass *)this);
      pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).
                           super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                           .
                           super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                         );
      EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&builder_1,pPVar3,pMVar4,pIVar6->condition);
      bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&builder_1);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&builder_1);
      if (!bVar2) {
        pMVar4 = Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 getModule(&(this->
                            super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                            ).
                            super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                            .
                            super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          );
        Builder::Builder(&local_320,pMVar4);
        pEVar5 = pIVar6->condition;
        pEVar1 = (Expression *)(br->name).super_IString.str._M_len;
        ifFalse = Builder::makeConst<int>(&local_320,0);
        pSVar7 = Builder::makeSelect(&local_320,pEVar5,pEVar1,(Expression *)ifFalse);
        (br->name).super_IString.str._M_len = (size_t)pSVar7;
        (br->name).super_IString.str._M_str = (char *)pIVar6->ifTrue;
      }
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (!curr->ifFalse) {
      // if without an else. try to reduce
      //    if (condition) br  =>  br_if (condition)
      if (Break* br = curr->ifTrue->dynCast<Break>()) {
        if (canTurnIfIntoBrIf(
              curr->condition, br->value, getPassOptions(), *getModule())) {
          if (!br->condition) {
            br->condition = curr->condition;
          } else {
            // In this case we can replace
            //   if (condition1) br_if (condition2)
            // =>
            //   br_if select (condition1) (condition2) (i32.const 0)
            // In other words, we replace an if (3 bytes) with a select and a
            // zero (also 3 bytes). The size is unchanged, but the select may
            // be further optimizable, and if select does not branch we also
            // avoid one branch.
            // Multivalue selects are not supported
            if (br->value && br->value->type.isTuple()) {
              return;
            }
            // If running the br's condition unconditionally is too expensive,
            // give up.
            auto* zero = LiteralUtils::makeZero(Type::i32, *getModule());
            if (tooCostlyToRunUnconditionally(
                  getPassOptions(), br->condition, zero)) {
              return;
            }
            // Of course we can't do this if the br's condition has side
            // effects, as we would then execute those unconditionally.
            if (EffectAnalyzer(getPassOptions(), *getModule(), br->condition)
                  .hasSideEffects()) {
              return;
            }
            Builder builder(*getModule());
            // Note that we use the br's condition as the select condition.
            // That keeps the order of the two conditions as it was originally.
            br->condition =
              builder.makeSelect(br->condition, curr->condition, zero);
          }
          br->finalize();
          replaceCurrent(Builder(*getModule()).dropIfConcretelyTyped(br));
          anotherCycle = true;
        }
      }

      // if (condition-A) { if (condition-B) .. }
      //   =>
      // if (condition-A ? condition-B : 0) { .. }
      //
      // This replaces an if, which is 3 bytes, with a select plus a zero, which
      // is also 3 bytes. The benefit is that the select may be faster, and also
      // further optimizations may be possible on the select.
      if (auto* child = curr->ifTrue->dynCast<If>()) {
        if (child->ifFalse) {
          return;
        }
        // If running the child's condition unconditionally is too expensive,
        // give up.
        if (tooCostlyToRunUnconditionally(getPassOptions(), child->condition)) {
          return;
        }
        // Of course we can't do this if the inner if's condition has side
        // effects, as we would then execute those unconditionally.
        if (EffectAnalyzer(getPassOptions(), *getModule(), child->condition)
              .hasSideEffects()) {
          return;
        }
        Builder builder(*getModule());
        curr->condition = builder.makeSelect(
          child->condition, curr->condition, builder.makeConst(int32_t(0)));
        curr->ifTrue = child->ifTrue;
      }
    }
    // TODO: if-else can be turned into a br_if as well, if one of the sides is
    //       a dead end we handle the case of a returned value to a local.set
    //       later down, see visitLocalSet.
  }